

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.cpp
# Opt level: O0

bool __thiscall cashew::Ref::operator==(Ref *this,IString *str)

{
  bool bVar1;
  Value *pVVar2;
  bool local_19;
  IString *str_local;
  Ref *this_local;
  
  pVVar2 = get(this);
  bVar1 = cashew::Value::isString(pVVar2);
  local_19 = false;
  if (bVar1) {
    pVVar2 = get(this);
    local_19 = ::wasm::IString::operator==(&(pVVar2->field_1).str,str);
  }
  return local_19;
}

Assistant:

bool Ref::operator==(const IString& str) {
  return get()->isString() && get()->str == str;
}